

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O2

void bcm2835_pwm_set_clock(uint32_t divisor)

{
  uint32_t uVar1;
  uint millis;
  
  if ((bcm2835_clk != (uint32_t *)0xffffffffffffffff) &&
     (bcm2835_pwm != (uint32_t *)0xffffffffffffffff)) {
    bcm2835_peri_write(bcm2835_clk + 0x28,0x5a000001);
    millis = 0x6e;
    do {
      bcm2835_delay(millis);
      uVar1 = bcm2835_peri_read(bcm2835_clk + 0x28);
      millis = 1;
    } while ((char)uVar1 < '\0');
    bcm2835_peri_write(bcm2835_clk + 0x29,(divisor & 0xfff) << 0xc | 0x5a000000);
    bcm2835_peri_write(bcm2835_clk + 0x28,0x5a000011);
    return;
  }
  return;
}

Assistant:

void bcm2835_pwm_set_clock(uint32_t divisor)
{
    if (   bcm2835_clk == MAP_FAILED
        || bcm2835_pwm == MAP_FAILED)
      return; /* bcm2835_init() failed or not root */
  
    /* From Gerts code */
    divisor &= 0xfff;
    /* Stop PWM clock */
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_CNTL, BCM2835_PWM_PASSWRD | 0x01);
    bcm2835_delay(110); /* Prevents clock going slow */
    /* Wait for the clock to be not busy */
    while ((bcm2835_peri_read(bcm2835_clk + BCM2835_PWMCLK_CNTL) & 0x80) != 0)
	bcm2835_delay(1); 
    /* set the clock divider and enable PWM clock */
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_DIV, BCM2835_PWM_PASSWRD | (divisor << 12));
    bcm2835_peri_write(bcm2835_clk + BCM2835_PWMCLK_CNTL, BCM2835_PWM_PASSWRD | 0x11); /* Source=osc and enable */
}